

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.h
# Opt level: O1

void __thiscall
__gnu_cxx::
new_allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>
::
construct<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData,draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>
          (new_allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>
           *this,AttributeData *__p,AttributeData *__args)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Bit_type *p_Var4;
  pointer pIVar5;
  pointer pIVar6;
  pointer pIVar7;
  MeshAttributeCornerTable *pMVar8;
  pointer pcVar9;
  pointer piVar10;
  
  __p->attribute_index = __args->attribute_index;
  (__p->connectivity_data).is_edge_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage =
       (__args->connectivity_data).is_edge_on_seam_.super__Bvector_base<std::allocator<bool>_>.
       _M_impl.super__Bvector_impl_data._M_end_of_storage;
  uVar1 = (__args->connectivity_data).is_edge_on_seam_.super__Bvector_base<std::allocator<bool>_>.
          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar2 = *(undefined8 *)
           ((long)&(__args->connectivity_data).is_edge_on_seam_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8);
  uVar3 = *(undefined8 *)
           ((long)&(__args->connectivity_data).is_edge_on_seam_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8);
  (__p->connectivity_data).is_edge_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (__args->connectivity_data).is_edge_on_seam_.super__Bvector_base<std::allocator<bool>_>.
       _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  *(undefined8 *)
   ((long)&(__p->connectivity_data).is_edge_on_seam_.super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = uVar3;
  (__p->connectivity_data).is_edge_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)uVar1;
  *(undefined8 *)
   ((long)&(__p->connectivity_data).is_edge_on_seam_.super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = uVar2;
  (__args->connectivity_data).is_edge_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(__args->connectivity_data).is_edge_on_seam_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (__args->connectivity_data).is_edge_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(__args->connectivity_data).is_edge_on_seam_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (__args->connectivity_data).is_edge_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__p->connectivity_data).is_vertex_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage =
       (__args->connectivity_data).is_vertex_on_seam_.super__Bvector_base<std::allocator<bool>_>.
       _M_impl.super__Bvector_impl_data._M_end_of_storage;
  p_Var4 = (__args->connectivity_data).is_vertex_on_seam_.super__Bvector_base<std::allocator<bool>_>
           ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar1 = *(undefined8 *)
           ((long)&(__args->connectivity_data).is_vertex_on_seam_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8);
  uVar2 = *(undefined8 *)
           ((long)&(__args->connectivity_data).is_vertex_on_seam_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8);
  (__p->connectivity_data).is_vertex_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (__args->connectivity_data).is_vertex_on_seam_.super__Bvector_base<std::allocator<bool>_>.
       _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  *(undefined8 *)
   ((long)&(__p->connectivity_data).is_vertex_on_seam_.super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = uVar2;
  (__p->connectivity_data).is_vertex_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = p_Var4;
  *(undefined8 *)
   ((long)&(__p->connectivity_data).is_vertex_on_seam_.super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = uVar1;
  (__args->connectivity_data).is_vertex_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(__args->connectivity_data).is_vertex_on_seam_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (__args->connectivity_data).is_vertex_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(__args->connectivity_data).is_vertex_on_seam_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (__args->connectivity_data).is_vertex_on_seam_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__p->connectivity_data).no_interior_seams_ = (__args->connectivity_data).no_interior_seams_;
  pIVar5 = (__args->connectivity_data).corner_to_vertex_map_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__p->connectivity_data).corner_to_vertex_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__args->connectivity_data).corner_to_vertex_map_.
       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p->connectivity_data).corner_to_vertex_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pIVar5;
  (__p->connectivity_data).corner_to_vertex_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->connectivity_data).corner_to_vertex_map_.
       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->connectivity_data).corner_to_vertex_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->connectivity_data).corner_to_vertex_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->connectivity_data).corner_to_vertex_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar6 = (__args->connectivity_data).vertex_to_left_most_corner_map_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__p->connectivity_data).vertex_to_left_most_corner_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__args->connectivity_data).vertex_to_left_most_corner_map_.
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p->connectivity_data).vertex_to_left_most_corner_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pIVar6;
  (__p->connectivity_data).vertex_to_left_most_corner_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->connectivity_data).vertex_to_left_most_corner_map_.
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->connectivity_data).vertex_to_left_most_corner_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->connectivity_data).vertex_to_left_most_corner_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->connectivity_data).vertex_to_left_most_corner_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar7 = (__args->connectivity_data).vertex_to_attribute_entry_id_map_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__p->connectivity_data).vertex_to_attribute_entry_id_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__args->connectivity_data).vertex_to_attribute_entry_id_map_.
       super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p->connectivity_data).vertex_to_attribute_entry_id_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pIVar7;
  (__p->connectivity_data).vertex_to_attribute_entry_id_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->connectivity_data).vertex_to_attribute_entry_id_map_.
       super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->connectivity_data).vertex_to_attribute_entry_id_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->connectivity_data).vertex_to_attribute_entry_id_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->connectivity_data).vertex_to_attribute_entry_id_map_.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar8 = (__args->connectivity_data).valence_cache_.table_;
  (__p->connectivity_data).corner_table_ = (__args->connectivity_data).corner_table_;
  (__p->connectivity_data).valence_cache_.table_ = pMVar8;
  pcVar9 = *(pointer *)
            ((long)&(__args->connectivity_data).valence_cache_.vertex_valence_cache_8_bit_.vector_.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  (__p->connectivity_data).valence_cache_.vertex_valence_cache_8_bit_.vector_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (__args->connectivity_data).valence_cache_.vertex_valence_cache_8_bit_.vector_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__p->connectivity_data).valence_cache_.vertex_valence_cache_8_bit_.vector_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data + 8) = pcVar9;
  *(pointer *)
   ((long)&(__p->connectivity_data).valence_cache_.vertex_valence_cache_8_bit_.vector_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       *(pointer *)
        ((long)&(__args->connectivity_data).valence_cache_.vertex_valence_cache_8_bit_.vector_.
                super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data + 0x10);
  *(pointer *)
   ((long)&(__args->connectivity_data).valence_cache_.vertex_valence_cache_8_bit_.vector_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (__args->connectivity_data).valence_cache_.vertex_valence_cache_8_bit_.vector_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(__args->connectivity_data).valence_cache_.vertex_valence_cache_8_bit_.vector_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  piVar10 = *(pointer *)
             ((long)&(__args->connectivity_data).valence_cache_.vertex_valence_cache_32_bit_.vector_
                     .super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             + 8);
  (__p->connectivity_data).valence_cache_.vertex_valence_cache_32_bit_.vector_.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (__args->connectivity_data).valence_cache_.vertex_valence_cache_32_bit_.vector_.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__p->connectivity_data).valence_cache_.vertex_valence_cache_32_bit_.vector_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8) =
       piVar10;
  *(pointer *)
   ((long)&(__p->connectivity_data).valence_cache_.vertex_valence_cache_32_bit_.vector_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10) =
       *(pointer *)
        ((long)&(__args->connectivity_data).valence_cache_.vertex_valence_cache_32_bit_.vector_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10
        );
  *(pointer *)
   ((long)&(__args->connectivity_data).valence_cache_.vertex_valence_cache_32_bit_.vector_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 0x10) =
       (pointer)0x0;
  (__args->connectivity_data).valence_cache_.vertex_valence_cache_32_bit_.vector_.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(__args->connectivity_data).valence_cache_.vertex_valence_cache_32_bit_.vector_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8) =
       (pointer)0x0;
  __p->is_connectivity_used = __args->is_connectivity_used;
  pIVar6 = (__args->encoding_data).encoded_attribute_value_index_to_corner_map.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__p->encoding_data).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__args->encoding_data).encoded_attribute_value_index_to_corner_map.
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p->encoding_data).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pIVar6;
  (__p->encoding_data).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->encoding_data).encoded_attribute_value_index_to_corner_map.
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->encoding_data).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->encoding_data).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->encoding_data).encoded_attribute_value_index_to_corner_map.
  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  piVar10 = (__args->encoding_data).vertex_to_encoded_attribute_value_index_map.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  (__p->encoding_data).vertex_to_encoded_attribute_value_index_map.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (__args->encoding_data).vertex_to_encoded_attribute_value_index_map.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  (__p->encoding_data).vertex_to_encoded_attribute_value_index_map.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar10;
  (__p->encoding_data).vertex_to_encoded_attribute_value_index_map.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->encoding_data).vertex_to_encoded_attribute_value_index_map.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (__args->encoding_data).vertex_to_encoded_attribute_value_index_map.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (__args->encoding_data).vertex_to_encoded_attribute_value_index_map.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__args->encoding_data).vertex_to_encoded_attribute_value_index_map.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__p->encoding_data).num_values = (__args->encoding_data).num_values;
  __p->traversal_method = __args->traversal_method;
  return;
}

Assistant:

AttributeData() : attribute_index(-1), is_connectivity_used(true) {}